

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

void SetLogStreams(ImportData *imp)

{
  long lVar1;
  char *name;
  uint local_14;
  uint flags;
  ImportData *imp_local;
  
  printf("\nAttaching log stream   ...           OK\n");
  lVar1 = std::__cxx11::string::length();
  local_14 = (uint)(lVar1 != 0);
  if ((imp->showLog & 1U) != 0) {
    local_14 = local_14 | 4;
  }
  name = (char *)std::__cxx11::string::c_str();
  Assimp::DefaultLogger::create(name,(uint)((imp->verbose & 1U) != 0),local_14,(IOSystem *)0x0);
  return;
}

Assistant:

void SetLogStreams(const ImportData& imp)
{
	printf("\nAttaching log stream   ...           OK\n");
		
	unsigned int flags = 0;
	if (imp.logFile.length()) {
		flags |= aiDefaultLogStream_FILE;
	}
	if (imp.showLog) {
		flags |= aiDefaultLogStream_STDERR;
	}
	DefaultLogger::create(imp.logFile.c_str(),imp.verbose ? Logger::VERBOSE : Logger::NORMAL,flags);
}